

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

HANDLE OpenProcess(DWORD dwDesiredAccess,BOOL bInheritHandle,DWORD dwProcessId)

{
  HANDLE local_60;
  HANDLE hProcess;
  CObjectAttributes oa;
  CProcProcessLocalData *pLocalData;
  IDataLock *pDataLock;
  IPalObject *pobjProcessRegistered;
  IPalObject *pobjProcess;
  CPalThread *pThread;
  PAL_ERROR palError;
  DWORD dwProcessId_local;
  BOOL bInheritHandle_local;
  DWORD dwDesiredAccess_local;
  
  pobjProcessRegistered = (IPalObject *)0x0;
  pDataLock = (IDataLock *)0x0;
  pThread._4_4_ = dwProcessId;
  palError = bInheritHandle;
  dwProcessId_local = dwDesiredAccess;
  CorUnix::CObjectAttributes::CObjectAttributes((CObjectAttributes *)&hProcess);
  local_60 = (HANDLE)0x0;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  pobjProcess = (IPalObject *)CorUnix::InternalGetCurrentThread();
  if (pThread._4_4_ == 0) {
    pThread._0_4_ = 0x57;
  }
  else {
    pThread._0_4_ =
         (**(code **)*CorUnix::g_pObjectManager)
                   (CorUnix::g_pObjectManager,pobjProcess,CorUnix::otProcess,&hProcess,
                    &pobjProcessRegistered);
    if (((DWORD)pThread == 0) &&
       (pThread._0_4_ =
             (*pobjProcessRegistered->_vptr_IPalObject[3])
                       (pobjProcessRegistered,pobjProcess,1,&pLocalData,&oa.pSecurityAttributes),
       (DWORD)pThread == 0)) {
      (oa.pSecurityAttributes)->nLength = pThread._4_4_;
      (*(code *)**(undefined8 **)pLocalData)(pLocalData,pobjProcess,1);
      pThread._0_4_ =
           (**(code **)(*CorUnix::g_pObjectManager + 8))
                     (CorUnix::g_pObjectManager,pobjProcess,pobjProcessRegistered,&aotProcess,
                      dwProcessId_local,&local_60,&pDataLock);
      pobjProcessRegistered = (IPalObject *)0x0;
    }
  }
  if (pobjProcessRegistered != (IPalObject *)0x0) {
    (*pobjProcessRegistered->_vptr_IPalObject[8])(pobjProcessRegistered,pobjProcess);
  }
  if (pDataLock != (IDataLock *)0x0) {
    (*pDataLock->_vptr_IDataLock[8])(pDataLock,pobjProcess);
  }
  if ((DWORD)pThread != 0) {
    CorUnix::CPalThread::SetLastError((DWORD)pThread);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return local_60;
  }
  abort();
}

Assistant:

HANDLE
PALAPI
OpenProcess(
        DWORD dwDesiredAccess,
        BOOL bInheritHandle,
        DWORD dwProcessId)
{
    PAL_ERROR palError;
    CPalThread *pThread;
    IPalObject *pobjProcess = NULL;
    IPalObject *pobjProcessRegistered = NULL;
    IDataLock *pDataLock;
    CProcProcessLocalData *pLocalData;
    CObjectAttributes oa;
    HANDLE hProcess = NULL;

    PERF_ENTRY(OpenProcess);
    ENTRY("OpenProcess(dwDesiredAccess=0x%08x, bInheritHandle=%d, "
          "dwProcessId = 0x%08x)\n",
          dwDesiredAccess, bInheritHandle, dwProcessId );

    pThread = InternalGetCurrentThread();

    if (0 == dwProcessId)
    {
        palError = ERROR_INVALID_PARAMETER;
        goto OpenProcessExit;
    }

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otProcess,
        &oa,
        &pobjProcess
        );

    if (NO_ERROR != palError)
    {
        goto OpenProcessExit;
    }

    palError = pobjProcess->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto OpenProcessExit;
    }

    pLocalData->dwProcessId = dwProcessId;
    pDataLock->ReleaseLock(pThread, TRUE);

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pobjProcess,
        &aotProcess,
        dwDesiredAccess,
        &hProcess,
        &pobjProcessRegistered
        );

    //
    // pobjProcess was invalidated by the above call, so NULL
    // it out here
    //

    pobjProcess = NULL;

    //
    // TODO: check to see if the process actually exists?
    //

OpenProcessExit:

    if (NULL != pobjProcess)
    {
        pobjProcess->ReleaseReference(pThread);
    }

    if (NULL != pobjProcessRegistered)
    {
        pobjProcessRegistered->ReleaseReference(pThread);
    }

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }

    LOGEXIT("OpenProcess returns HANDLE %p\n", hProcess);
    PERF_EXIT(OpenProcess);
    return hProcess;
}